

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

string * __thiscall
cmMakefileTargetGenerator::GetLinkRule
          (string *__return_storage_ptr__,cmMakefileTargetGenerator *this,string *linkRuleVar)

{
  cmGeneratorTarget *pcVar1;
  bool bVar2;
  string *psVar3;
  cmValue cVar4;
  string ruleVar;
  string local_e0;
  cmAlphaNum local_c0;
  string local_90;
  string local_70;
  cmAlphaNum local_50;
  
  psVar3 = cmMakefile::GetRequiredDefinition
                     ((this->super_cmCommonTargetGenerator).Makefile,linkRuleVar);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar3);
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_((string *)&local_c0,this);
  bVar2 = cmGeneratorTarget::HasImplibGNUtoMS(pcVar1,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  if (bVar2) {
    local_c0.View_._M_len = (size_t)&DAT_00000006;
    local_c0.View_._M_str = "CMAKE_";
    pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    GetConfigName_abi_cxx11_(&local_90,this);
    cmGeneratorTarget::GetLinkerLanguage(&local_e0,pcVar1,&local_90);
    local_50.View_._M_len = local_e0._M_string_length;
    local_50.View_._M_str = local_e0._M_dataplus._M_p;
    cmStrCat<char[14]>(&local_70,&local_c0,&local_50,(char (*) [14])"_GNUtoMS_RULE");
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_90);
    cVar4 = cmMakefile::GetDefinition((this->super_cmCommonTargetGenerator).Makefile,&local_70);
    if (cVar4.Value != (string *)0x0) {
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    std::__cxx11::string::~string((string *)&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmMakefileTargetGenerator::GetLinkRule(
  const std::string& linkRuleVar)
{
  std::string linkRule = this->Makefile->GetRequiredDefinition(linkRuleVar);
  if (this->GeneratorTarget->HasImplibGNUtoMS(this->GetConfigName())) {
    std::string ruleVar =
      cmStrCat("CMAKE_",
               this->GeneratorTarget->GetLinkerLanguage(this->GetConfigName()),
               "_GNUtoMS_RULE");
    if (cmValue rule = this->Makefile->GetDefinition(ruleVar)) {
      linkRule += *rule;
    }
  }
  return linkRule;
}